

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O2

bool __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<int,double>::
is_dominated_by<boost::container::flat_set<int,std::less<int>,void>>
          (Flag_complex_edge_collapser<int,double> *this,flat_set<int,_std::less<int>,_void> *e_ngb,
          int c,double f)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  stored_size_type sVar4;
  reference piVar5;
  vec_iterator<std::pair<int,_double>_*,_false> *pvVar6;
  vec_iterator<int_*,_true> *pvVar7;
  pointer bg_1;
  pointer bg;
  pair<int,_double> *ppVar8;
  iterator ci;
  const_iterator eni;
  vec_iterator<std::pair<int,_double>_*,_false> local_40;
  double local_38;
  vec_iterator<int_*,_true> local_30;
  
  local_40.m_ptr = *(pair<int,_double> **)(*(long *)this + (long)c * 0x18);
  lVar3 = *(long *)(*(long *)this + 8 + (long)c * 0x18);
  local_30.m_ptr =
       (e_ngb->super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>).m_data
       .m_seq.m_holder.m_start;
  sVar4 = (e_ngb->super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>).
          m_data.m_seq.m_holder.m_size;
  local_38 = f;
  if (sVar4 == 0) {
    __assert_fail("eni != ene",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa5,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<int, double>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = int, Filtration_value = double, Ngb = boost::container::flat_set<int>]"
                 );
  }
  if (lVar3 == 0) {
    __assert_fail("ci != ce",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa6,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<int, double>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = int, Filtration_value = double, Ngb = boost::container::flat_set<int>]"
                 );
  }
  ppVar8 = local_40.m_ptr + lVar3;
  piVar1 = local_30.m_ptr + sVar4;
  while( true ) {
    piVar5 = boost::container::vec_iterator<int_*,_true>::operator*(&local_30);
    iVar2 = *piVar5;
    while ((local_40.m_ptr)->first < iVar2) {
      pvVar6 = boost::container::vec_iterator<std::pair<int,_double>_*,_false>::operator++
                         (&local_40);
      if (pvVar6->m_ptr == ppVar8) {
        return false;
      }
    }
    if (iVar2 < (local_40.m_ptr)->first) {
      return false;
    }
    if (local_38 < (local_40.m_ptr)->second) {
      return false;
    }
    pvVar7 = boost::container::vec_iterator<int_*,_true>::operator++(&local_30);
    if (pvVar7->m_ptr == piVar1) break;
    pvVar6 = boost::container::vec_iterator<std::pair<int,_double>_*,_false>::operator++(&local_40);
    if (pvVar6->m_ptr == ppVar8) {
      return false;
    }
  }
  return true;
}

Assistant:

bool is_dominated_by(Ngb const& e_ngb, Vertex c, Filtration_value f){
    // The best strategy probably depends on the distribution, how sparse / dense the adjacency matrix is,
    // how (un)balanced the sizes of e_ngb and nc are.
    // Some efficient operations on sets work best with bitsets, although the need for a map complicates things.
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    for(auto v : e_ngb) {
      // if(v==c)continue;
      if(neighbors_dense(v,c) > f) return false;
    }
    return true;
#else
    auto&&nc = neighbors[c];
    // if few neighbors, use dichotomy? Seems slower.
    // I tried storing a copy of neighbors as a vector<absl::flat_hash_map> and using it for nc, but it was
    // a bit slower here. It did help with neighbors[dominator].find(w) in the main function though,
    // sometimes enough, sometimes not.
    auto ci = nc.begin();
    auto ce = nc.end();
    auto eni = e_ngb.begin();
    auto ene = e_ngb.end();
    assert(eni != ene);
    assert(ci != ce);
    // if(*eni == c && ++eni == ene) return true;
    for(;;){
      Vertex ve = *eni;
      Vertex vc = ci->first;
      while(ve > vc) {
        // try a gallop strategy (exponential search)? Seems slower
        if(++ci == ce) return false;
        vc = ci->first;
      }
      if(ve < vc) return false;
      // ve == vc
      if(ci->second > f) return false;
      if(++eni == ene)return true;
      // If we stored an open neighborhood of c (excluding c), we would need to test for c here and before the loop
      // if(*eni == c && ++eni == ene)return true;
      if(++ci == ce) return false;
    }
#endif
  }